

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

int doParseXmlDecl(_func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *encodingFinder,
                  int isGeneralTextEntity,ENCODING *enc,char *ptr,char *end,char **badPtr,
                  char **versionPtr,char **versionEndPtr,char **encodingName,ENCODING **encoding,
                  int *standalone)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  ENCODING *pEVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *end_00;
  char *local_60;
  char *nameEnd;
  char *val;
  char *name;
  _func_ENCODING_ptr_ENCODING_ptr_char_ptr_char_ptr *local_40;
  char **local_38;
  
  val = (char *)0x0;
  name = (char *)0x0;
  nameEnd = (char *)0x0;
  local_60 = ptr + (long)enc->minBytesPerChar * 5;
  end_00 = end + (long)enc->minBytesPerChar * -2;
  local_40 = encodingFinder;
  local_38 = badPtr;
  iVar2 = parsePseudoAttribute(enc,local_60,end_00,&name,&nameEnd,&val,&local_60);
  pcVar5 = name;
  pcVar7 = nameEnd;
  pcVar6 = local_60;
  if (iVar2 == 0 || name == (char *)0x0) goto LAB_00150f99;
  iVar2 = (*enc->nameMatchesAscii)(enc,name,nameEnd,"version");
  if (iVar2 == 0) {
    pcVar6 = pcVar5;
    if (isGeneralTextEntity == 0) goto LAB_00150f99;
  }
  else {
    if (versionPtr != (char **)0x0) {
      *versionPtr = val;
    }
    if (versionEndPtr != (char **)0x0) {
      *versionEndPtr = local_60;
    }
    iVar2 = parsePseudoAttribute(enc,local_60,end_00,&name,&nameEnd,&val,&local_60);
    pcVar6 = local_60;
    if (iVar2 == 0) goto LAB_00150f99;
    pcVar7 = nameEnd;
    pcVar5 = name;
    if (name == (char *)0x0) {
      if (isGeneralTextEntity == 0) {
        return 1;
      }
      goto LAB_00150f99;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar5,pcVar7,"encoding");
  pcVar6 = val;
  if (iVar2 != 0) {
    uVar3 = toAscii(enc,val,end_00);
    pcVar7 = local_60;
    if (0x19 < (uVar3 & 0xffffffdf) - 0x41) goto LAB_00150f99;
    if (encodingName != (char **)0x0) {
      *encodingName = pcVar6;
    }
    if (encoding != (ENCODING **)0x0) {
      pEVar4 = (*local_40)(enc,pcVar6,local_60 + -(long)enc->minBytesPerChar);
      *encoding = pEVar4;
    }
    iVar2 = parsePseudoAttribute(enc,pcVar7,end_00,&name,&nameEnd,&val,&local_60);
    pcVar6 = local_60;
    if (iVar2 == 0) goto LAB_00150f99;
    pcVar7 = nameEnd;
    pcVar5 = name;
    if (name == (char *)0x0) {
      return 1;
    }
  }
  iVar2 = (*enc->nameMatchesAscii)(enc,pcVar5,pcVar7,"standalone");
  pcVar1 = val;
  pcVar7 = local_60;
  pcVar6 = pcVar5;
  if ((isGeneralTextEntity != 0) || (iVar2 == 0)) goto LAB_00150f99;
  iVar2 = (*enc->nameMatchesAscii)(enc,val,local_60 + -(long)enc->minBytesPerChar,"yes");
  if (iVar2 == 0) {
    iVar2 = (*enc->nameMatchesAscii)(enc,pcVar1,pcVar7 + -(long)enc->minBytesPerChar,"no");
    pcVar6 = pcVar1;
    if (iVar2 == 0) goto LAB_00150f99;
    iVar2 = 0;
    if (standalone != (int *)0x0) goto LAB_00150fdb;
  }
  else if (standalone != (int *)0x0) {
    iVar2 = 1;
LAB_00150fdb:
    *standalone = iVar2;
  }
  while ((uVar3 = toAscii(enc,pcVar7,end_00), uVar3 < 0x21 &&
         ((0x100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0))) {
    pcVar7 = pcVar7 + enc->minBytesPerChar;
  }
  pcVar6 = pcVar7;
  if (pcVar7 == end_00) {
    return 1;
  }
LAB_00150f99:
  *local_38 = pcVar6;
  return 0;
}

Assistant:

static
int doParseXmlDecl(const ENCODING *(*encodingFinder)(const ENCODING *,
                                                     const char *,
                                                     const char *),
                   int isGeneralTextEntity,
                   const ENCODING *enc,
                   const char *ptr,
                   const char *end,
                   const char **badPtr,
                   const char **versionPtr,
                   const char **versionEndPtr,
                   const char **encodingName,
                   const ENCODING **encoding,
                   int *standalone)
{
  const char *val = 0;
  const char *name = 0;
  const char *nameEnd = 0;
  ptr += 5 * enc->minBytesPerChar;
  end -= 2 * enc->minBytesPerChar;
  if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr) || !name) {
    *badPtr = ptr;
    return 0;
  }
  if (!XmlNameMatchesAscii(enc, name, nameEnd, KW_version)) {
    if (!isGeneralTextEntity) {
      *badPtr = name;
      return 0;
    }
  }
  else {
    if (versionPtr)
      *versionPtr = val;
    if (versionEndPtr)
      *versionEndPtr = ptr;
    if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (!name) {
      if (isGeneralTextEntity) {
        /* a TextDecl must have an EncodingDecl */
        *badPtr = ptr;
        return 0;
      }
      return 1;
    }
  }
  if (XmlNameMatchesAscii(enc, name, nameEnd, KW_encoding)) {
    int c = toAscii(enc, val, end);
    if (!(ASCII_a <= c && c <= ASCII_z) && !(ASCII_A <= c && c <= ASCII_Z)) {
      *badPtr = val;
      return 0;
    }
    if (encodingName)
      *encodingName = val;
    if (encoding)
      *encoding = encodingFinder(enc, val, ptr - enc->minBytesPerChar);
    if (!parsePseudoAttribute(enc, ptr, end, &name, &nameEnd, &val, &ptr)) {
      *badPtr = ptr;
      return 0;
    }
    if (!name)
      return 1;
  }
  if (!XmlNameMatchesAscii(enc, name, nameEnd, KW_standalone) || isGeneralTextEntity) {
    *badPtr = name;
    return 0;
  }
  if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_yes)) {
    if (standalone)
      *standalone = 1;
  }
  else if (XmlNameMatchesAscii(enc, val, ptr - enc->minBytesPerChar, KW_no)) {
    if (standalone)
      *standalone = 0;
  }
  else {
    *badPtr = val;
    return 0;
  }
  while (isSpace(toAscii(enc, ptr, end)))
    ptr += enc->minBytesPerChar;
  if (ptr != end) {
    *badPtr = ptr;
    return 0;
  }
  return 1;
}